

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int evfilt_read_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  intptr_t iVar2;
  int *piVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  uint *in_R8;
  int i;
  epoll_event *ev;
  socklen_t slen;
  int serr;
  int ret;
  knote *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  socklen_t local_3c;
  int local_38;
  int local_34;
  undefined8 *local_28;
  undefined8 *local_10;
  int local_4;
  
  local_3c = 4;
  local_28 = in_RCX;
  local_10 = in_RDI;
  if ((*(uint *)(in_RCX + 4) & 1) == 0) {
    *in_RDI = *in_RCX;
    in_RDI[1] = in_RCX[1];
    in_RDI[2] = in_RCX[2];
    in_RDI[3] = in_RCX[3];
    if (((*in_R8 & 0x2000) != 0) || ((*in_R8 & 0x10) != 0)) {
      *(ushort *)((long)in_RDI + 10) = *(ushort *)((long)in_RDI + 10) | 0x8000;
    }
    if ((*in_R8 & 8) != 0) {
      if ((*(uint *)(in_RCX + 4) & 0x3e0) == 0) {
        *(undefined4 *)((long)in_RDI + 0xc) = 5;
        local_38 = in_stack_ffffffffffffffb0;
      }
      else {
        local_34 = getsockopt((int)*in_RCX,1,4,&local_38,&local_3c);
        if (local_34 < 0) {
          piVar3 = __errno_location();
          local_38 = *piVar3;
        }
        *(int *)((long)local_10 + 0xc) = local_38;
      }
      *(ushort *)((long)local_10 + 10) = *(ushort *)((long)local_10 + 10) | 0x8000;
      in_stack_ffffffffffffffb0 = local_38;
    }
    if ((*(uint *)(local_28 + 4) & 0x10) == 0) {
      iVar1 = ioctl((int)*local_10,0x541b,&stack0xffffffffffffffb4);
      if (iVar1 < 0) {
        local_10[2] = 0;
      }
      else {
        local_10[2] = (long)in_stack_ffffffffffffffb4;
        if ((local_10[2] == 0) && ((*(uint *)(local_28 + 4) & 0x20) != 0)) {
          *(ushort *)((long)local_10 + 10) = *(ushort *)((long)local_10 + 10) | 0x8000;
        }
      }
    }
    else {
      local_10[2] = 1;
    }
    iVar1 = knote_copyout_flag_actions
                      ((filter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    *in_RDI = *in_RCX;
    in_RDI[1] = in_RCX[1];
    in_RDI[2] = in_RCX[2];
    in_RDI[3] = in_RCX[3];
    iVar2 = get_eof_offset(nevents);
    local_10[2] = iVar2;
    if (local_10[2] == 0) {
      *(undefined2 *)(local_10 + 1) = 0;
      iVar1 = epoll_ctl(*(int *)(local_28 + 0xd),2,*(int *)(local_28 + 0x10),(epoll_event *)0x0);
      if (iVar1 < 0) {
        return -1;
      }
      *(undefined4 *)((long)local_28 + 0x6c) = 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
evfilt_read_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    int ret;
    int serr;
    socklen_t slen = sizeof(serr);
    struct epoll_event * const ev = (struct epoll_event *) ptr;

    /* Special case: for regular files, return the offset from current position to end of file */
    if (src->kn_flags & KNFL_FILE) {
        memcpy(dst, &src->kev, sizeof(*dst));
        dst->data = get_eof_offset(src->kev.ident);

        if (dst->data == 0) {
            dst->filter = 0;    /* Will cause the kevent to be discarded */
            if (epoll_ctl(src->kn_epollfd, EPOLL_CTL_DEL, src->kn_eventfd, NULL) < 0) {
                dbg_perror("epoll_ctl(2)");
                return (-1);
            }
            src->kn_registered = 0;

#if FIXME
            /* XXX-FIXME Switch to using kn_vnode.inotifyfd to monitor for IN_ATTRIB events
                         that may signify the file size has changed.

                         This code is not tested.
             */
            int inofd;
            char path[PATH_MAX];

            inofd = inotify_init();
            if (inofd < 0) {
                dbg_perror("inotify_init(2)");
                (void) close(inofd);
                return (-1);
            }
            src->kn_vnode.inotifyfd = inofd;
            if (linux_fd_to_path(path, sizeof(path), src->kev.ident) < 0)
                return (-1);
            if (inotify_add_watch(inofd, path, IN_ATTRIB) < 0) {
                dbg_perror("inotify_add_watch");
                return (-1);
            }
            if (epoll_ctl(src->kn_epollfd, EPOLL_CTL_ADD, src->kn_vnode.inotifyfd, NULL) < 0) {
                dbg_perror("epoll_ctl(2)");
                return (-1);
            }
            /* FIXME: race here, should we check the EOF status again ? */
#endif
        }

        return (1);
    }

    dbg_printf("epoll_ev=%s", epoll_event_dump(ev));
    memcpy(dst, &src->kev, sizeof(*dst));
#if defined(HAVE_EPOLLRDHUP)
    if (ev->events & EPOLLRDHUP || ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;
#else
    if (ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;
#endif
    if (ev->events & EPOLLERR) {
        if (src->kn_flags & KNFL_SOCKET) {
            ret = getsockopt(src->kev.ident, SOL_SOCKET, SO_ERROR, &serr, &slen);
            dst->fflags = ((ret < 0) ? errno : serr);
        } else
            dst->fflags = EIO;

        /*
         * The only way we seem to be able to signal an error
         * is by setting EOF on the socket.
         */
        dst->flags |= EV_EOF;
    }

    if (src->kn_flags & KNFL_SOCKET_PASSIVE) {
        /* On return, data contains the length of the
           socket backlog. This is not available under Linux.
         */
        dst->data = 1;
    } else {
        /* On return, data contains the number of bytes of protocol
           data available to read.
         */
        int i;
        if (ioctl(dst->ident, SIOCINQ, &i) < 0) {
            /* race condition with socket close, so ignore this error */
            dbg_puts("ioctl(2) of socket failed");
            dst->data = 0;
        } else {
            dst->data = i;
            if (dst->data == 0 && src->kn_flags & KNFL_SOCKET_STREAM)
                dst->flags |= EV_EOF;
        }
    }

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}